

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledLineOrder.cpp
# Opt level: O2

void testTiledLineOrder(string *tempDir)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  ostream *poVar4;
  int in_ECX;
  int extraout_EDX;
  int extraout_EDX_00;
  int h;
  int iVar5;
  char *pcVar6;
  int in_R8D;
  
  pcVar6 = "Testing line orders for tiled files and buffered/unbuffered tile writes";
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "Testing line orders for tiled files and buffered/unbuffered tile writes"
                          );
  std::endl<char,std::char_traits<char>>(poVar4);
  bVar1 = IlmThread_3_2::supportsThreads();
  for (iVar5 = 0; (uint)bVar1 + (uint)bVar1 * 2 + 1 != iVar5; iVar5 = iVar5 + 1) {
    cVar2 = IlmThread_3_2::supportsThreads();
    h = extraout_EDX;
    if (cVar2 != '\0') {
      Imf_3_2::setGlobalThreadCount(iVar5);
      poVar4 = std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      uVar3 = Imf_3_2::globalThreadCount();
      pcVar6 = (char *)(ulong)uVar3;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3);
      std::endl<char,std::char_traits<char>>(poVar4);
      h = extraout_EDX_00;
    }
    anon_unknown.dwarf_29cb3c::writeCopyRead(tempDir,(int)pcVar6,h,in_ECX,in_R8D);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar4);
  return;
}

Assistant:

void
testTiledLineOrder (const std::string& tempDir)
{
    try
    {
        cout << "Testing line orders for tiled files and "
                "buffered/unbuffered tile writes"
             << endl;

        const int W  = 171;
        const int H  = 259;
        const int XS = 55;
        const int YS = 55;

        int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads () ? 3 : 0;

        for (int n = 0; n <= maxThreads; ++n)
        {
            if (ILMTHREAD_NAMESPACE::supportsThreads ())
            {
                setGlobalThreadCount (n);
                cout << "\nnumber of threads: " << globalThreadCount () << endl;
            }

            writeCopyRead (tempDir, W, H, XS, YS);
        }

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}